

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  string *psVar1;
  ostream *poVar2;
  Colour colourGuard;
  Colour local_19;
  
  poVar2 = (this->super_StreamingReporterBase).stream;
  psVar1 = getDashes_abi_cxx11_();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  Colour::Colour(&local_19,Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&local_19);
  return;
}

Assistant:

void printOpenHeader( std::string const& _name ) {
            stream  << getDashes() << "\n";
            {
                Colour colourGuard( Colour::Headers );
                printHeaderString( _name );
            }
        }